

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

HelicsInput helicsFederateGetInputByTarget(HelicsFederate fed,char *target,HelicsError *err)

{
  size_t sVar1;
  Input *input;
  char *pcVar2;
  HelicsInput pvVar3;
  string_view target_00;
  shared_ptr<helics::ValueFederate> fedObj;
  ValueFederate *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  getValueFedSharedPtr(&local_30,(HelicsError *)fed);
  if (local_30 != (ValueFederate *)0x0) {
    if (target == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        pcVar2 = "The supplied string argument is null and therefore invalid";
LAB_001a82b7:
        err->error_code = -4;
        err->message = pcVar2;
      }
    }
    else {
      sVar1 = strlen(target);
      target_00._M_str = target;
      target_00._M_len = sVar1;
      input = helics::ValueFederate::getInputByTarget(local_30,target_00);
      if ((input->super_Interface).handle.hid != -1700000000) {
        pvVar3 = anon_unknown.dwarf_7c6ff::findOrCreateInput(fed,input);
        goto LAB_001a82c4;
      }
      if (err != (HelicsError *)0x0) {
        pcVar2 = "the specified input target is a not a recognized";
        goto LAB_001a82b7;
      }
    }
  }
  pvVar3 = (HelicsInput)0x0;
LAB_001a82c4:
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return pvVar3;
}

Assistant:

HelicsInput helicsFederateGetInputByTarget(HelicsFederate fed, const char* target, HelicsError* err)
{
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    CHECK_NULL_STRING(target, nullptr);
    try {
        auto& input = fedObj->getInputByTarget(target);
        if (!input.isValid()) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidTargetKey);
            return nullptr;
        }
        return findOrCreateInput(fed, input);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    // LCOV_EXCL_STOP
}